

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

bool parse_literal(const_iterator *it,const_iterator *end,string *expected)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__lhs;
  undefined8 *in_RDI;
  const_iterator tmp_it;
  const_iterator expected_it;
  int in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28 [3];
  undefined8 *local_10;
  
  local_10 = in_RDI;
  local_28[0]._M_current = (char *)std::__cxx11::string::begin();
  local_30._M_current = (char *)*local_10;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
    if (bVar1) {
      std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffffc0,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
      if (bVar1) {
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_30);
        in_stack_ffffffffffffffb8 = (int)*pcVar2;
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(local_28);
        in_stack_ffffffffffffffbc =
             CONCAT13(in_stack_ffffffffffffffb8 == *pcVar2,(int3)in_stack_ffffffffffffffbc);
      }
    }
    if ((char)(in_stack_ffffffffffffffbc >> 0x18) == '\0') break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_28);
  }
  __lhs = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::__cxx11::string::end();
  bVar1 = __gnu_cxx::operator==
                    (__lhs,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (bVar1) {
    *local_10 = local_30._M_current;
  }
  return bVar1;
}

Assistant:

static bool parse_literal(std::string::const_iterator & it, const std::string::const_iterator & end, const std::string & expected) {
    auto expected_it = expected.begin();
    auto tmp_it = it;
    while (tmp_it != end && expected_it != expected.end() && *tmp_it == *expected_it) {
        ++tmp_it;
        ++expected_it;
    }
    if (expected_it == expected.end()) {
        it = tmp_it;
        return true;
    }
    return false;
}